

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O1

int Min_CubesDistTwo(Min_Cube_t *pCube0,Min_Cube_t *pCube1,int *pVar0,int *pVar1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar4 = *(uint *)&pCube0->field_0x8 >> 10 & 0xfff;
  if (uVar4 == 0) {
    uVar5 = 0xffffffff;
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = 0xffffffff;
    uVar6 = 0;
    uVar7 = 0;
    uVar5 = 0xffffffff;
    do {
      if (pCube0->uData[uVar7] != pCube1->uData[uVar7]) {
        if (-1 < (int)(uVar5 | uVar2)) {
          return 0;
        }
        uVar8 = pCube1->uData[uVar7] ^ pCube0->uData[uVar7];
        uVar8 = uVar8 >> 1 | uVar8;
        if ((-1 < (int)(uVar5 & uVar2)) && (uVar9 = uVar8 & 0x55555555, (uVar9 & uVar9 - 1) != 0)) {
          return 0;
        }
        uVar10 = 0xfffffffe;
        uVar9 = uVar6;
        do {
          uVar1 = uVar5;
          if ((((uVar8 >> (uVar10 + 2 & 0x1f) & 1) != 0) && (uVar1 = uVar9, uVar5 != 0xffffffff)) &&
             (bVar11 = uVar2 != 0xffffffff, uVar1 = uVar5, uVar2 = uVar9, bVar11)) {
            return 0;
          }
          uVar5 = uVar1;
          uVar10 = uVar10 + 2;
          uVar9 = uVar9 + 1;
        } while (uVar10 < 0x1e);
      }
      uVar7 = uVar7 + 1;
      uVar6 = uVar6 + 0x10;
    } while (uVar7 != uVar4);
  }
  if ((int)(uVar5 | uVar2) < 0) {
    iVar3 = 0;
    if (uVar2 == 0xffffffff || uVar5 == 0xffffffff) {
      putchar(10);
      Min_CubeWrite(_stdout,pCube0);
      Min_CubeWrite(_stdout,pCube1);
      puts("Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!");
    }
  }
  else {
    *pVar0 = uVar5;
    *pVar1 = uVar2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static inline int Min_CubesDistTwo( Min_Cube_t * pCube0, Min_Cube_t * pCube1, int * pVar0, int * pVar1 )
{
    unsigned uData;//, uData2;
    int i, k, Var0 = -1, Var1 = -1;
    for ( i = 0; i < (int)pCube0->nWords; i++ )
    {
        uData = pCube0->uData[i] ^ pCube1->uData[i];
        if ( uData == 0 )
            continue;
        if ( Var0 >= 0 && Var1 >= 0 ) // more than two 1s
            return 0;
        uData = (uData | (uData >> 1)) & 0x55555555;
        if ( (Var0 >= 0 || Var1 >= 0) && (uData & (uData-1)) > 0 )
            return 0;
        for ( k = 0; k < 32; k += 2 )
            if ( uData & (1 << k) )
            {
                if ( Var0 == -1 )
                    Var0 = 16 * i + k/2;
                else if ( Var1 == -1 )
                    Var1 = 16 * i + k/2;
                else
                    return 0;
            }
        /*
        if ( Var0 >= 0 )
        {
            uData &= 0xFFFF;
            uData2 = (uData >> 16);
            if ( uData && uData2 )
                return 0;
            if ( uData )
            {
            }
            uData }= uData2;
            uData &= 0x
        }
        */
    }
    if ( Var0 >= 0 && Var1 >= 0 )
    {
        *pVar0 = Var0;
        *pVar1 = Var1;
        return 1;
    }
    if ( Var0 == -1 || Var1 == -1 )
    {
        printf( "\n" );
        Min_CubeWrite( stdout, pCube0 );
        Min_CubeWrite( stdout, pCube1 );
        printf( "Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!\n" );
    }
    return 0;
}